

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall
mjs::for_in_statement::for_in_statement
          (for_in_statement *this,source_extend *extend,statement_ptr *init,expression_ptr *e,
          statement_ptr *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  statement *psVar2;
  uint32_t uVar3;
  int iVar4;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001d9118;
  (this->super_statement).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_statement).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar3 = extend->end;
  (this->super_statement).super_syntax_node.extend_.start = extend->start;
  (this->super_statement).super_syntax_node.extend_.end = uVar3;
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__for_in_statement_001d9670;
  (this->init_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (init->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t
       .super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (init->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  (this->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t
  .super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (e->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
       super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (e->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  (this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
       super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (s->_M_t).super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  psVar2 = (this->init_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar2 != (statement *)0x0) {
    iVar4 = (**(code **)((long)(psVar2->super_syntax_node)._vptr_syntax_node + 0x18))();
    if (iVar4 != 4) {
      iVar4 = (**(code **)((long)(((this->init_)._M_t.
                                   super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                                   .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl)->
                                 super_syntax_node)._vptr_syntax_node + 0x18))();
      if ((iVar4 != 1) ||
         (psVar2 = (this->init_)._M_t.
                   super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
                   super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                   super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,
         *(long *)&psVar2[1].super_syntax_node.extend_.file.
                   super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2> -
         (long)psVar2[1].super_syntax_node._vptr_syntax_node != 0x28)) goto LAB_0017fdb0;
    }
    if ((this->e_)._M_t.
        super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
        super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)0x0) {
      __assert_fail("e_",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h"
                    ,0x2cb,
                    "mjs::for_in_statement::for_in_statement(const source_extend &, statement_ptr &&, expression_ptr &&, statement_ptr &&)"
                   );
    }
    if ((this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
        _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
        super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl != (statement *)0x0) {
      return;
    }
    __assert_fail("s_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x2cc,
                  "mjs::for_in_statement::for_in_statement(const source_extend &, statement_ptr &&, expression_ptr &&, statement_ptr &&)"
                 );
  }
LAB_0017fdb0:
  __assert_fail("init_ && (init_->type() == statement_type::expression || (init_->type() == statement_type::variable && static_cast<variable_statement&>(*init_).l().size() == 1))"
                ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x2ca,
                "mjs::for_in_statement::for_in_statement(const source_extend &, statement_ptr &&, expression_ptr &&, statement_ptr &&)"
               );
}

Assistant:

explicit for_in_statement(const source_extend& extend, statement_ptr&& init, expression_ptr&& e, statement_ptr&& s) : statement(extend), init_(std::move(init)), e_(std::move(e)), s_(std::move(s)) {
        assert(init_ && (init_->type() == statement_type::expression || (init_->type() == statement_type::variable && static_cast<variable_statement&>(*init_).l().size() == 1)));
        assert(e_);
        assert(s_);
    }